

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

int file_stdio_fungetc(ALLEGRO_FILE *f,int c)

{
  int errnum;
  USERDATA *pUVar1;
  int *piVar2;
  int in_ESI;
  int rc;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffd8;
  
  pUVar1 = get_userdata(in_stack_ffffffffffffffd8);
  errnum = ungetc(in_ESI,(FILE *)pUVar1->fp);
  if (errnum == -1) {
    piVar2 = __errno_location();
    pUVar1->errnum = *piVar2;
    __errno_location();
    al_set_errno(errnum);
  }
  return errnum;
}

Assistant:

static int file_stdio_fungetc(ALLEGRO_FILE *f, int c)
{
   USERDATA *userdata = get_userdata(f);
   int rc;

   rc = ungetc(c, userdata->fp);
   if (rc == EOF) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return rc;
}